

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

bool __thiscall ASigil::HandlePickup(ASigil *this,AInventory *item)

{
  TObjPtr<AActor> *obj;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  AInventory *pAVar4;
  undefined8 extraout_RDX;
  TObjPtr<AInventory> *obj_00;
  
  bVar1 = DObject::IsKindOf((DObject *)item,RegistrationInfo.MyClass);
  if (bVar1) {
    iVar2 = *(int *)((long)&item[1].super_AActor.Angles.CamRoll.Degrees + 4);
    bVar1 = true;
    if (*(int *)&(this->super_AWeapon).field_0x584 < iVar2) {
      *(byte *)&item->ItemFlags = (byte)item->ItemFlags | 4;
      (this->super_AWeapon).super_AInventory.Icon.texnum = (item->Icon).texnum;
      obj = &(this->super_AWeapon).super_AInventory.Owner;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (pAVar3->player != (player_t *)0x0) {
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
        if ((ASigil *)pAVar3->player->ReadyWeapon == this) {
          this->DownPieces = *(int *)&(this->super_AWeapon).field_0x584;
          pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
          pAVar3->player->PendingWeapon = &this->super_AWeapon;
        }
      }
      *(int *)&(this->super_AWeapon).field_0x584 = iVar2;
    }
  }
  else {
    obj_00 = &(this->super_AWeapon).super_AInventory.super_AActor.Inventory;
    pAVar4 = GC::ReadBarrier<AInventory>((AInventory **)obj_00);
    if (pAVar4 != (AInventory *)0x0) {
      pAVar4 = GC::ReadBarrier<AInventory>((AInventory **)obj_00);
      UNRECOVERED_JUMPTABLE =
           (pAVar4->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x37];
      iVar2 = (*UNRECOVERED_JUMPTABLE)(pAVar4,item,extraout_RDX,UNRECOVERED_JUMPTABLE);
      return SUB41(iVar2,0);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ASigil::HandlePickup (AInventory *item)
{
	if (item->IsKindOf (RUNTIME_CLASS(ASigil)))
	{
		int otherPieces = static_cast<ASigil*>(item)->NumPieces;
		if (otherPieces > NumPieces)
		{
			item->ItemFlags |= IF_PICKUPGOOD;
			Icon = item->Icon;
			// If the player is holding the Sigil right now, drop it and bring
			// it back with the new piece(s) in view.
			if (Owner->player != NULL && Owner->player->ReadyWeapon == this)
			{
				DownPieces = NumPieces;
				Owner->player->PendingWeapon = this;
			}
			NumPieces = otherPieces;
		}
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}